

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

QXmlStreamNamespaceDeclarations * __thiscall
QXmlStreamReader::namespaceDeclarations
          (QXmlStreamNamespaceDeclarations *__return_storage_ptr__,QXmlStreamReader *this)

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> this_00;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  if ((*(qsizetype *)((long)&(this_00._M_head_impl)->publicNamespaceDeclarations + 0x10) == 0) &&
     ((this_00._M_head_impl)->type == StartElement)) {
    QXmlStreamReaderPrivate::resolvePublicNamespaces(this_00._M_head_impl);
  }
  QArrayDataPointer<QXmlStreamNamespaceDeclaration>::QArrayDataPointer
            (&__return_storage_ptr__->d,&((this_00._M_head_impl)->publicNamespaceDeclarations).d);
  return __return_storage_ptr__;
}

Assistant:

QXmlStreamNamespaceDeclarations QXmlStreamReader::namespaceDeclarations() const
{
    Q_D(const QXmlStreamReader);
    if (d->publicNamespaceDeclarations.isEmpty() && d->type == StartElement)
        const_cast<QXmlStreamReaderPrivate *>(d)->resolvePublicNamespaces();
    return d->publicNamespaceDeclarations;
}